

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,complex<double> *val)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  double dVar7;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 in_XMM1_Qa;
  undefined1 in_stack_00000048 [16];
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  vector<double,_std::allocator<double>_> vec;
  NamedPoint npval;
  data_view *in_stack_00000158;
  Time time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  data_view *in_stack_fffffffffffffe78;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_138;
  complex<double> local_110;
  undefined8 local_100;
  complex<double> *in_stack_ffffffffffffff08;
  defV *in_stack_ffffffffffffff10;
  complex<double> local_d8;
  __sv_type local_c8;
  double local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  complex<double> local_50;
  complex<double> local_38;
  complex<double> local_28;
  undefined8 *local_18;
  
  local_18 = in_RDX;
  switch(in_ESI) {
  case 0:
  case 9:
  default:
    local_70 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                         ((data_view *)in_stack_fffffffffffffe60);
    helicsGetComplex((string_view)in_stack_00000048);
    *local_18 = extraout_XMM0_Qa;
    local_18[1] = in_XMM1_Qa;
    break;
  case 1:
    dVar7 = ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe60);
    std::complex<double>::complex(&local_28,dVar7,0.0);
    *local_18 = local_28._M_value._0_8_;
    local_18[1] = local_28._M_value._8_8_;
    break;
  case 2:
    lVar3 = ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe60);
    std::complex<double>::complex(&local_38,(double)lVar3,0.0);
    *local_18 = local_38._M_value._0_8_;
    local_18[1] = local_38._M_value._8_8_;
    break;
  case 3:
    ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe60);
    *local_18 = extraout_XMM0_Qa_01;
    local_18[1] = in_XMM1_Qa;
    break;
  case 4:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              (in_stack_fffffffffffffe78);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10);
    if (sVar4 == 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10,0);
      std::complex<double>::complex((complex<double> *)&stack0xffffffffffffff00,*pvVar5,0.0);
      *local_18 = local_100;
      local_18[1] = in_stack_ffffffffffffff08;
    }
    else {
      sVar4 = std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10);
      if (1 < sVar4) {
        this = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff10;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,0);
        in_stack_fffffffffffffe70 = (vector<double,_std::allocator<double>_> *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this,1);
        std::complex<double>::complex(&local_110,(double)in_stack_fffffffffffffe70,*pvVar5);
        *local_18 = local_110._M_value._0_8_;
        local_18[1] = local_110._M_value._8_8_;
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe70);
    break;
  case 5:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret(in_stack_fffffffffffffe78);
    bVar1 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::empty
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       in_stack_fffffffffffffe70);
    if (!bVar1) {
      pvVar6 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                         (&local_138,0);
      *local_18 = *(undefined8 *)pvVar6->_M_value;
      local_18[1] = *(undefined8 *)(pvVar6->_M_value + 8);
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe70);
    break;
  case 6:
    ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe78);
    uVar2 = std::isnan(local_78);
    if ((uVar2 & 1) == 0) {
      std::complex<double>::complex(&local_d8,local_78,0.0);
      *local_18 = local_d8._M_value._0_8_;
      local_18[1] = local_d8._M_value._8_8_;
    }
    else {
      local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60)
      ;
      helicsGetComplex((string_view)in_stack_00000048);
      *local_18 = extraout_XMM0_Qa_00;
      local_18[1] = in_XMM1_Qa;
    }
    NamedPoint::~NamedPoint((NamedPoint *)0x427d0f);
    break;
  case 8:
    ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe60);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68,(time_units)((ulong)in_stack_fffffffffffffe60 >> 0x20));
    dVar7 = TimeRepresentation::operator_cast_to_double
                      ((TimeRepresentation<count_time<9,_long>_> *)0x427b4f);
    std::complex<double>::complex(&local_50,dVar7,0.0);
    *local_18 = local_50._M_value._0_8_;
    local_18[1] = local_50._M_value._8_8_;
    break;
  case 0x1e:
    readJsonValue_abi_cxx11_(in_stack_00000158);
    valueExtract(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::
    variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x427f06);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::complex<double>& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = std::complex<double>(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val =
                std::complex<double>(static_cast<double>(ValueConverter<int64_t>::interpret(data)),
                                     0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val = std::complex<double>(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetComplex(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplex(npval.name);
            } else {
                val = std::complex<double>(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val = std::complex<double>(vec[0], 0.0);
            } else if (vec.size() >= 2) {
                val = std::complex<double>(vec[0], vec[1]);
            }
            break;
        }
        case DataType::HELICS_COMPLEX:
            val = ValueConverter<std::complex<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (!cvec.empty()) {
                val = cvec[0];
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}